

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityStateUpdatePdu.cpp
# Opt level: O0

void __thiscall DIS::EntityStateUpdatePdu::EntityStateUpdatePdu(EntityStateUpdatePdu *this)

{
  EntityStateUpdatePdu *this_local;
  
  EntityInformationFamilyPdu::EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  (this->super_EntityInformationFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__EntityStateUpdatePdu_00267730;
  EntityID::EntityID(&this->_entityID);
  this->_padding1 = '\0';
  this->_numberOfVariableParameters = '\0';
  Vector3Float::Vector3Float(&this->_entityLinearVelocity);
  Vector3Double::Vector3Double(&this->_entityLocation);
  EulerAngles::EulerAngles(&this->_entityOrientation);
  this->_entityAppearance = 0;
  std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::vector
            (&this->_variableParameters);
  PduSuperclass::setPduType((PduSuperclass *)this,'C');
  PduSuperclass::setProtocolFamily((PduSuperclass *)this,'\x01');
  return;
}

Assistant:

EntityStateUpdatePdu::EntityStateUpdatePdu() : EntityInformationFamilyPdu(),
   _entityID(), 
   _padding1(0), 
   _numberOfVariableParameters(0), 
   _entityLinearVelocity(), 
   _entityLocation(), 
   _entityOrientation(), 
   _entityAppearance(0)
{
    setPduType( 67 );
    setProtocolFamily( 1 );
}